

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuEvent> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  QDBusMenuEvent item;
  undefined1 *local_78;
  Data *pDStack_70;
  char16_t *local_68;
  qsizetype qStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuEvent>::clear(list);
  while( true ) {
    cVar1 = QDBusArgument::atEnd();
    if (cVar1 != '\0') break;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    qStack_60 = 0;
    local_58.shared = (PrivateShared *)0x0;
    pDStack_70 = (Data *)0x0;
    local_68 = (char16_t *)0x0;
    uStack_40 = 2;
    operator>>(arg,(QDBusMenuEvent *)&local_78);
    QList<QDBusMenuEvent>::emplaceBack<QDBusMenuEvent_const&>(list,(QDBusMenuEvent *)&local_78);
    QDBusMenuEvent::~QDBusMenuEvent((QDBusMenuEvent *)&local_78);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}